

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  byte bVar1;
  uint32_t uVar2;
  Descriptor *pDVar3;
  char *pcVar4;
  void *pvVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage local_30;
  
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((bVar1 & 0x20) == 0) goto LAB_002a1175;
    if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == cpp_type) ||
       ((cpp_type == CPPTYPE_INT32 &&
        (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == CPPTYPE_ENUM)
        ))) {
      if (message_type == (Descriptor *)0x0) {
LAB_002a1114:
        if ((bVar1 & 8) == 0) {
          pcVar4 = GetRawNonOneof<char>(this,message,field);
          return pcVar4;
        }
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        pvVar5 = internal::ExtensionSet::GetRawRepeatedField
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                            field->number_,internal::kZeroBuffer);
        return pvVar5;
      }
      pDVar3 = FieldDescriptor::message_type(field);
      if (pDVar3 == message_type) {
        bVar1 = field->field_0x1;
        goto LAB_002a1114;
      }
      RepeatedFieldData();
      goto LAB_002a11f1;
    }
  }
  else {
    RepeatedFieldData();
LAB_002a1175:
    RepeatedFieldData();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xd58,
             "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
            );
  str._M_str = "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ";
  str._M_len = 0x3e;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str);
  str_00._M_str = "the actual field type (for enums T should be the generated enum ";
  str_00._M_len = 0x40;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str_00)
  ;
  str_01._M_str = "type or int32_t).";
  str_01._M_len = 0x11;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str_01)
  ;
LAB_002a11f1:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

const void* Reflection::RepeatedFieldData(
    const Message& message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type, const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    return &GetRawNonOneof<char>(message, field);
  }
}